

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::Y_formatter<spdlog::details::null_scoped_padder>::format
          (Y_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char acStack_23 [3];
  char *local_20;
  
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar4 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffffc8,(ulong)uVar3);
  local_20 = pcVar4;
  if (iVar2 < -0x76c) {
    local_20 = pcVar4 + -1;
    pcVar4[-1] = '-';
  }
  if (-0x16 < (long)(&stack0xffffffffffffffc8 + -(long)local_20)) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,
               local_20 + (long)(&stack0xffffffffffffffc8 + -(long)local_20 + 0x15));
    return;
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffd0,0,in_stack_ffffffffffffffc8);
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }